

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::ProcessNoImplicitCallArrayUses
          (GlobOpt *this,RegOpnd *baseOpnd,ArrayRegOpnd *baseArrayOpnd,Instr *instr,
          bool isLikelyJsArray,bool useNoMissingValues)

{
  StackSym *sym;
  RegOpnd *opnd;
  undefined3 in_register_00000081;
  undefined1 local_38 [8];
  AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
  
  if (CONCAT31(in_register_00000081,isLikelyJsArray) != 0) {
    CaptureNoImplicitCallUses(this,&baseOpnd->super_Opnd,true,(Instr *)0x0);
    return;
  }
  if ((baseArrayOpnd != (ArrayRegOpnd *)0x0) &&
     (sym = baseArrayOpnd->headSegmentLengthSym, sym != (StackSym *)0x0)) {
    opnd = IR::RegOpnd::New(sym,sym->m_type,instr->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_38,&opnd->super_Opnd,instr->m_func,true)
    ;
    CaptureNoImplicitCallUses(this,&opnd->super_Opnd,false,(Instr *)0x0);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_38);
  }
  return;
}

Assistant:

void
GlobOpt::ProcessNoImplicitCallArrayUses(IR::RegOpnd * baseOpnd, IR::ArrayRegOpnd * baseArrayOpnd, IR::Instr * instr, bool isLikelyJsArray, bool useNoMissingValues)
{
    if (isLikelyJsArray)
    {
        // Insert an instruction to indicate to the dead-store pass that implicit calls need to be kept disabled until this
        // instruction. Operations other than LdElem, StElem and IsIn don't benefit much from arrays having no missing values,
        // so no need to ensure that the array still has no missing values. For a particular array, if none of the accesses
        // benefit much from the no-missing-values information, it may be beneficial to avoid checking for no missing
        // values, especially in the case for a single array access, where the cost of the check could be relatively
        // significant. An StElem has to do additional checks in the common path if the array may have missing values, and
        // a StElem that operates on an array that has no missing values is more likely to keep the no-missing-values info
        // on the array more precise, so it still benefits a little from the no-missing-values info.
        this->CaptureNoImplicitCallUses(baseOpnd, isLikelyJsArray);
    }
    else if (baseArrayOpnd && baseArrayOpnd->HeadSegmentLengthSym())
    {
        // A typed array's array buffer may be transferred to a web worker as part of an implicit call, in which case the typed
        // array's length is set to zero. Insert an instruction to indicate to the dead-store pass that implicit calls need to
        // be disabled until this instruction.
        IR::RegOpnd *const headSegmentLengthOpnd =
            IR::RegOpnd::New(
                baseArrayOpnd->HeadSegmentLengthSym(),
                baseArrayOpnd->HeadSegmentLengthSym()->GetType(),
                instr->m_func);

        const IR::AutoReuseOpnd autoReuseHeadSegmentLengthOpnd(headSegmentLengthOpnd, instr->m_func);
        this->CaptureNoImplicitCallUses(headSegmentLengthOpnd, false);
    }
}